

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light.c
# Opt level: O2

void snuff_light_source(int x,int y)

{
  obj *obj;
  boolean bVar1;
  ls_t *plVar2;
  
  plVar2 = (ls_t *)&level->lev_lights;
  do {
    do {
      do {
        plVar2 = plVar2->next;
        if (plVar2 == (ls_t *)0x0) {
          return;
        }
      } while (((plVar2->type != 0) || (plVar2->x != x)) || (plVar2->y != y));
      obj = (obj *)plVar2->id;
      bVar1 = obj_is_burning(obj);
    } while (bVar1 == '\0');
    bVar1 = artifact_light(obj);
  } while (bVar1 != '\0');
  end_burn(obj,obj->otyp != 0xe9);
  return;
}

Assistant:

void snuff_light_source(int x, int y)
{
    light_source *ls;
    struct obj *obj;

    for (ls = level->lev_lights; ls; ls = ls->next)
	/*
	Is this position check valid??? Can I assume that the positions
	will always be correct because the objects would have been
	updated with the last vision update?  [Is that recent enough???]
	*/
	if (ls->type == LS_OBJECT && ls->x == x && ls->y == y) {
	    obj = (struct obj *) ls->id;
	    if (obj_is_burning(obj)) {
		/* The only way to snuff Sunsword is to unwield it.  Darkness
		 * scrolls won't affect it.  (If we got here because it was
		 * dropped or thrown inside a monster, this won't matter anyway
		 * because it will go out when dropped.)
		 */
		if (artifact_light(obj)) continue;
		end_burn(obj, obj->otyp != MAGIC_LAMP);
		/*
		 * The current ls element has just been removed (and
		 * ls->next is now invalid).  Return assuming that there
		 * is only one light source attached to each object.
		 */
		return;
	    }
	}
}